

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O0

void ComputerThink(Situation *situation)

{
  Movement move;
  clock_t cVar1;
  undefined8 uVar2;
  ostream *poVar3;
  Situation *in_RDI;
  bool bVar4;
  Movement MVar5;
  ofstream f;
  ofstream f_1;
  int move_num;
  Movement move_list [128];
  Movement book_move;
  Movement best_move_save;
  int max_depth;
  int value;
  Movement *in_stack_fffffffffffff4b0;
  int *in_stack_fffffffffffff4b8;
  undefined4 in_stack_fffffffffffff4c0;
  undefined4 in_stack_fffffffffffff4c4;
  ostream *in_stack_fffffffffffff4d8;
  Situation *in_stack_fffffffffffff4e0;
  ostream *in_stack_fffffffffffff4e8;
  undefined4 in_stack_fffffffffffff4f0;
  _Ios_Openmode in_stack_fffffffffffff4f4;
  undefined8 in_stack_fffffffffffff4f8;
  undefined4 in_stack_fffffffffffff500;
  Movement in_stack_fffffffffffff524;
  string local_8e0 [32];
  ostream local_8c0 [516];
  int local_6bc;
  Movement local_6b8 [130];
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_90;
  undefined4 local_88;
  string local_80 [36];
  undefined8 local_5c;
  undefined4 local_54;
  undefined8 local_4c;
  undefined4 local_44;
  Movement local_40;
  undefined8 local_2c;
  undefined4 local_24;
  Movement local_20;
  int local_10;
  int local_c;
  Situation *local_8;
  
  isTimeLimit = false;
  step = 0;
  local_8 = in_RDI;
  ResetHashTable();
  ResetHistory();
  StartTime = clock();
  MVar5 = local_40;
  if ((local_8->UseBook & 1U) != 0) {
    MVar5 = ReadBookTable(local_8);
    local_40._0_8_ = MVar5._0_8_;
    local_2c._0_1_ = local_40.from;
    local_2c._1_1_ = local_40.to;
    local_2c._2_1_ = local_40.capture;
    local_2c._3_1_ = local_40._3_1_;
    local_2c._4_4_ = local_40.value;
    uVar2 = local_2c;
    local_40._8_4_ = MVar5._8_4_;
    local_24._0_1_ = local_40.catc;
    local_24._1_1_ = local_40.movec;
    local_24._2_2_ = local_40._10_2_;
    local_2c._0_1_ = MVar5.from;
    bVar4 = (UINT8)local_2c != '\0';
    local_2c = uVar2;
    if (bVar4) {
      local_4c._0_1_ = local_40.from;
      local_4c._1_1_ = local_40.to;
      local_4c._2_1_ = local_40.capture;
      local_4c._3_1_ = local_40._3_1_;
      local_4c._4_4_ = local_40.value;
      local_44._0_1_ = local_40.catc;
      local_44._1_1_ = local_40.movec;
      local_44._2_2_ = local_40._10_2_;
      local_5c._0_1_ = local_40.from;
      local_5c._1_1_ = local_40.to;
      local_5c._2_1_ = local_40.capture;
      local_5c._3_1_ = local_40._3_1_;
      local_5c._4_4_ = local_40.value;
      local_54._0_1_ = local_40.catc;
      local_54._1_1_ = local_40.movec;
      local_54._2_2_ = local_40._10_2_;
      move.catc = (char)in_stack_fffffffffffff500;
      move.movec = (char)((uint)in_stack_fffffffffffff500 >> 8);
      move._10_2_ = (short)((uint)in_stack_fffffffffffff500 >> 0x10);
      move.from = (char)in_stack_fffffffffffff4f8;
      move.to = (char)((ulong)in_stack_fffffffffffff4f8 >> 8);
      move.capture = (char)((ulong)in_stack_fffffffffffff4f8 >> 0x10);
      move._3_1_ = (char)((ulong)in_stack_fffffffffffff4f8 >> 0x18);
      move.value = (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20);
      local_40 = MVar5;
      bVar4 = MovementsLegal(move,in_stack_fffffffffffff4e0);
      MVar5 = local_40;
      if (bVar4) {
        local_88 = local_24;
        local_90 = local_2c;
        local_98 = local_24;
        local_a0 = local_2c;
        MovementToStr_abi_cxx11_(in_stack_fffffffffffff524);
        uVar2 = std::__cxx11::string::c_str();
        printf("bestmove %s\n",uVar2);
        std::__cxx11::string::~string(local_80);
        fflush(_stdout);
        return;
      }
    }
  }
  local_40 = MVar5;
  local_6bc = 0;
  InitRootMove((Situation *)CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
               in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  if (local_6bc == 1) {
    local_20.from = local_6b8[0].from;
    local_20.to = local_6b8[0].to;
    local_20.capture = local_6b8[0].capture;
    local_20._3_1_ = local_6b8[0]._3_1_;
    local_20.value = local_6b8[0].value;
    local_20.catc = local_6b8[0].catc;
    local_20.movec = local_6b8[0].movec;
    local_20._10_2_ = local_6b8[0]._10_2_;
  }
  else {
    for (local_10 = 1; local_10 < 0x19; local_10 = local_10 + 1) {
      NowMaxDepth = local_10;
      local_c = SearchRoot((Situation *)
                           CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0),
                           (int)((ulong)in_stack_fffffffffffff4e8 >> 0x20),
                           (Movement *)in_stack_fffffffffffff4e0,
                           (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20));
      if ((isTimeLimit & 1U) != 0) break;
      local_20.catc = BestMove.catc;
      local_20.movec = BestMove.movec;
      local_20._10_2_ = BestMove._10_2_;
      local_20.from = BestMove.from;
      local_20.to = BestMove.to;
      local_20.capture = BestMove.capture;
      local_20._3_1_ = BestMove._3_1_;
      local_20.value = BestMove.value;
      debug_value = local_c;
      std::ofstream::ofstream(local_8c0);
      in_stack_fffffffffffff4f4 = std::operator|(_S_app,_S_out);
      std::ofstream::open((char *)local_8c0,0x11a359);
      in_stack_fffffffffffff4e8 = std::operator<<(local_8c0,"Depth: ");
      in_stack_fffffffffffff4e0 =
           (Situation *)std::ostream::operator<<(in_stack_fffffffffffff4e8,local_10);
      in_stack_fffffffffffff4d8 = std::operator<<((ostream *)in_stack_fffffffffffff4e0," Time: ");
      cVar1 = clock();
      poVar3 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffff4d8,cVar1 - StartTime);
      std::operator<<(poVar3,"ms \n");
      std::ofstream::close();
      std::ofstream::~ofstream(local_8c0);
      if (0x26f8 < local_c) break;
    }
  }
  if (local_20.from == local_20.to) {
    printf("nobestmove\n");
    fflush(_stdout);
  }
  else {
    MovementToStr_abi_cxx11_(in_stack_fffffffffffff524);
    uVar2 = std::__cxx11::string::c_str();
    printf("bestmove %s\n",uVar2);
    std::__cxx11::string::~string(local_8e0);
    fflush(_stdout);
  }
  std::ofstream::ofstream(&stack0xfffffffffffff500);
  std::operator|(_S_app,_S_out);
  std::ofstream::open(&stack0xfffffffffffff500,0x11a359);
  poVar3 = std::operator<<((ostream *)&stack0xfffffffffffff500,"Bestmove\'s value: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,debug_value);
  std::operator<<(poVar3,'\n');
  std::operator<<((ostream *)&stack0xfffffffffffff500,"=========================================\n")
  ;
  std::ofstream::close();
  std::ofstream::~ofstream(&stack0xfffffffffffff500);
  return;
}

Assistant:

void ComputerThink(Situation& situation){
    int value, max_depth;
    Movement best_move_save;
    isTimeLimit = false;
    step = 0;
    ResetHashTable();   // 清空置换表
    ResetHistory();     // 清空历史表和杀手表
    StartTime = clock();

    // 读取开局库
    if(situation.UseBook){
        Movement book_move = ReadBookTable(situation);
        if(book_move.from != 0 && MovementsLegal(book_move, situation)){
            printf ("bestmove %s\n", MovementToStr(book_move).c_str());
		    fflush (stdout);
            return;
        }
    }

    Movement move_list[128];            // 当前所有着法
    int move_num = 0;
    InitRootMove(situation, move_num, move_list);
    // 唯一着法，不必搜索直接返回
    if(move_num == 1){
        best_move_save = move_list[0];
    }
    else{
        // 迭代加深搜索
        for(max_depth = 1; max_depth <= MAX_DEPTH; max_depth++){
            NowMaxDepth = max_depth;
            value = SearchRoot(situation, max_depth, move_list, move_num);
            if(isTimeLimit){
                break;
            }
            else{
                best_move_save = BestMove;
                debug_value = value;
                // 输出日志文件(每层搜索结果)
                std::ofstream f;
                f.open("debug.log", std::ios::app | std::ios::out);
                f << "Depth: " << max_depth << " Time: " << clock() - StartTime << "ms \n";
                f.close();
            }
            if(value > WIN_VALUE) break;
        }
    }


    // 必败 认输
    if(best_move_save.from == best_move_save.to){
        printf ( "nobestmove\n" ); // 认输
		fflush (stdout);
    }
    // 输出最优着法
    else{
        printf ("bestmove %s\n", MovementToStr(best_move_save).c_str());
		fflush (stdout);
    }

    // 输出日志文件(返回最佳着法)
    std::ofstream f;
    f.open("debug.log", std::ios::app | std::ios::out);
    f << "Bestmove's value: " << debug_value << '\n';
    f << "=========================================\n";
    f.close();
    return;
}